

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_page(int *ip)

{
  int iVar1;
  
  if (proc_ptr != (t_proc *)0x0) {
    fatal_error("PAGE can not be changed in procs!");
    return;
  }
  labldef(loccnt,1);
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (7 < value) {
      error("Invalid page index!");
      return;
    }
    page = value;
    if (pass == 1) {
      loadlc(value << 0xd,1);
      println();
      return;
    }
  }
  return;
}

Assistant:

void
do_page(int *ip)
{
	/* not allowed in procs */
	if (proc_ptr) {
		fatal_error("PAGE can not be changed in procs!");
		return;
	}

	/* define label */
	labldef(loccnt, 1);

	/* get page index */
	if (!evaluate(ip, ';'))
		return;
	if (value > 7) {
		error("Invalid page index!");
		return;
	}
	page = value;

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(value << 13, 1);
		println();
	}
}